

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::BlockExprBase<(wabt::ExprType)7>::~BlockExprBase(BlockExprBase<(wabt::ExprType)7> *this)

{
  BlockExprBase<(wabt::ExprType)7> *this_local;
  
  (this->super_ExprMixin<(wabt::ExprType)7>).super_Expr._vptr_Expr =
       (_func_int **)&PTR__BlockExprBase_0038ee78;
  Block::~Block(&this->block);
  ExprMixin<(wabt::ExprType)7>::~ExprMixin(&this->super_ExprMixin<(wabt::ExprType)7>);
  return;
}

Assistant:

explicit BlockExprBase(const Location& loc = Location())
      : ExprMixin<TypeEnum>(loc) {}